

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pjpeg-idct.c
# Opt level: O0

void pjpeg_idct_2D_double(int32_t *in,uint8_t *out,uint32_t outstride)

{
  int iVar1;
  int local_648;
  int i_1;
  int x_1;
  int y_1;
  int x;
  int y;
  double tmp [64];
  int local_42c;
  int i;
  double dout [64];
  double din [64];
  uint32_t outstride_local;
  uint8_t *out_local;
  int32_t *in_local;
  
  for (local_42c = 0; local_42c < 0x40; local_42c = local_42c + 1) {
    dout[(long)local_42c + 0x3f] = (double)in[local_42c];
  }
  for (y_1 = 0; y_1 < 8; y_1 = y_1 + 1) {
    idct_1D_double(dout + (long)(y_1 << 3) + 0x3f,1,(double *)(&x + (long)(y_1 << 3) * 2),1);
  }
  for (x_1 = 0; x_1 < 8; x_1 = x_1 + 1) {
    idct_1D_double((double *)(&x + (long)x_1 * 2),8,
                   (double *)(&stack0xfffffffffffffbd8 + (long)x_1 * 8),8);
  }
  for (i_1 = 0; i_1 < 8; i_1 = i_1 + 1) {
    for (local_648 = 0; local_648 < 8; local_648 = local_648 + 1) {
      iVar1 = i_1 * 8 + local_648;
      *(double *)(&stack0xfffffffffffffbd8 + (long)iVar1 * 8) =
           *(double *)(&stack0xfffffffffffffbd8 + (long)iVar1 * 8) / 4.0 + 128.0;
      if (*(double *)(&stack0xfffffffffffffbd8 + (long)iVar1 * 8) <= 0.0 &&
          *(double *)(&stack0xfffffffffffffbd8 + (long)iVar1 * 8) != 0.0) {
        *(undefined8 *)(&stack0xfffffffffffffbd8 + (long)iVar1 * 8) = 0;
      }
      if (255.0 < *(double *)(&stack0xfffffffffffffbd8 + (long)iVar1 * 8)) {
        *(undefined8 *)(&stack0xfffffffffffffbd8 + (long)iVar1 * 8) = 0x406fe00000000000;
      }
      out[i_1 * outstride + local_648] =
           (uint8_t)(int)*(double *)(&stack0xfffffffffffffbd8 + (long)iVar1 * 8);
    }
  }
  return;
}

Assistant:

void pjpeg_idct_2D_double(int32_t in[64], uint8_t *out, uint32_t outstride)
{
    double din[64], dout[64];
    for (int i = 0; i < 64; i++)
        din[i] = in[i];

    double tmp[64];

    // idct on rows
    for (int y = 0; y < 8; y++)
        idct_1D_double(&din[8*y], 1, &tmp[8*y], 1);

    // idct on columns
    for (int x = 0; x < 8; x++)
        idct_1D_double(&tmp[x], 8, &dout[x], 8);

    // scale, adjust bias, and clamp
    for (int y = 0; y < 8; y++) {
        for (int x = 0; x < 8; x++) {
            int i = 8*y + x;

            dout[i] = (dout[i] / 4) + 128;
            if (dout[i] < 0)
                dout[i] = 0;
            if (dout[i] > 255)
                dout[i] = 255;

            // XXX round by adding +.5?
            out[y*outstride + x] = dout[i];
        }
    }
}